

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void HMAC_init(uECC_HashContext *hash_context,uint8_t *K)

{
  uint8_t *puVar1;
  uint local_24;
  uint i;
  uint8_t *pad;
  uint8_t *K_local;
  uECC_HashContext *hash_context_local;
  
  puVar1 = hash_context->tmp + (hash_context->result_size << 1);
  for (local_24 = 0; local_24 < hash_context->result_size; local_24 = local_24 + 1) {
    puVar1[local_24] = K[local_24] ^ 0x36;
  }
  for (; local_24 < hash_context->block_size; local_24 = local_24 + 1) {
    puVar1[local_24] = '6';
  }
  (*hash_context->init_hash)(hash_context);
  (*hash_context->update_hash)(hash_context,puVar1,hash_context->block_size);
  return;
}

Assistant:

static void HMAC_init(const uECC_HashContext *hash_context, const uint8_t *K) {
    uint8_t *pad = hash_context->tmp + 2 * hash_context->result_size;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i)
        pad[i] = K[i] ^ 0x36;
    for (; i < hash_context->block_size; ++i)
        pad[i] = 0x36;

    hash_context->init_hash(hash_context);
    hash_context->update_hash(hash_context, pad, hash_context->block_size);
}